

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O0

string * __thiscall
tcu::formatError_abi_cxx11_
          (string *__return_storage_ptr__,tcu *this,char *message,char *expr,char *file,int line)

{
  ostream *poVar1;
  tcu *local_210;
  FilePath local_1f8;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream msg;
  int line_local;
  char *file_local;
  char *expr_local;
  char *message_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_210 = this;
  if (this == (tcu *)0x0) {
    local_210 = (tcu *)0xb16102;
  }
  std::operator<<((ostream *)local_1a8,(char *)local_210);
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a8,": \'");
    poVar1 = std::operator<<(poVar1,message);
    std::operator<<(poVar1,'\'');
  }
  if (expr != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a8," at ");
    de::FilePath::FilePath(&local_1f8,expr);
    de::FilePath::getBaseName_abi_cxx11_(&local_1d8,&local_1f8);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,(int)file);
    std::__cxx11::string::~string((string *)&local_1d8);
    de::FilePath::~FilePath(&local_1f8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed");

	if (expr)
		msg << ": '" << expr << '\'';

	if (file)
		msg << " at " << de::FilePath(file).getBaseName() << ":" << line;

	return msg.str();
}